

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void melee_effect_handler_LOSE_ALL(melee_effect_handler_context_t *context)

{
  _Bool _Var1;
  source origin;
  source origin_00;
  source origin_01;
  source sVar2;
  source sVar3;
  melee_effect_handler_context_t *context_local;
  
  _Var1 = monster_damage_target(context,true);
  if (!_Var1) {
    sVar2 = source_monster(context->mon->midx);
    sVar3.which = sVar2.which;
    sVar3._4_4_ = 0;
    sVar3.what = sVar2.what;
    effect_simple(L'\x11',sVar3,"0",L'\0',L'\0',L'\0',L'\0',L'\0',&context->obvious);
    sVar3 = source_monster(context->mon->midx);
    sVar2.which = sVar3.which;
    sVar2._4_4_ = 0;
    sVar2.what = sVar3.what;
    effect_simple(L'\x11',sVar2,"0",L'\x03',L'\0',L'\0',L'\0',L'\0',&context->obvious);
    sVar3 = source_monster(context->mon->midx);
    origin.which = sVar3.which;
    origin._4_4_ = 0;
    origin.what = sVar3.what;
    effect_simple(L'\x11',origin,"0",L'\x04',L'\0',L'\0',L'\0',L'\0',&context->obvious);
    sVar3 = source_monster(context->mon->midx);
    origin_00.which = sVar3.which;
    origin_00._4_4_ = 0;
    origin_00.what = sVar3.what;
    effect_simple(L'\x11',origin_00,"0",L'\x01',L'\0',L'\0',L'\0',L'\0',&context->obvious);
    sVar3 = source_monster(context->mon->midx);
    origin_01.which = sVar3.which;
    origin_01._4_4_ = 0;
    origin_01.what = sVar3.what;
    effect_simple(L'\x11',origin_01,"0",L'\x02',L'\0',L'\0',L'\0',L'\0',&context->obvious);
  }
  return;
}

Assistant:

static void melee_effect_handler_LOSE_ALL(melee_effect_handler_context_t *context)
{
	/* Take damage */
	if (monster_damage_target(context, true)) return;

	/* Damage (stats) */
	effect_simple(EF_DRAIN_STAT, source_monster(context->mon->midx), "0", STAT_STR, 0, 0, 0, 0, &context->obvious);
	effect_simple(EF_DRAIN_STAT, source_monster(context->mon->midx), "0", STAT_DEX, 0, 0, 0, 0, &context->obvious);
	effect_simple(EF_DRAIN_STAT, source_monster(context->mon->midx), "0", STAT_CON, 0, 0, 0, 0, &context->obvious);
	effect_simple(EF_DRAIN_STAT, source_monster(context->mon->midx), "0", STAT_INT, 0, 0, 0, 0, &context->obvious);
	effect_simple(EF_DRAIN_STAT, source_monster(context->mon->midx), "0", STAT_WIS, 0, 0, 0, 0, &context->obvious);
}